

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void I444ToARGBRow_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  
  if (0 < width) {
    lVar8 = 0;
    do {
      bVar1 = src_u[lVar8];
      uVar9 = (int)yuvconstants->kYToRgb[0] * (uint)src_y[lVar8] * 0x101 >> 0x10;
      iVar10 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)bVar1) + uVar9
      ;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      bVar2 = src_v[lVar8];
      cVar3 = yuvconstants->kUVToG[0];
      cVar4 = yuvconstants->kUVToG[1];
      cVar5 = yuvconstants->kUVToR[1];
      sVar6 = yuvconstants->kUVBiasG[0];
      sVar7 = yuvconstants->kUVBiasR[0];
      rgb_buf[lVar8 * 4] = (uint8_t)iVar10;
      iVar10 = ((int)sVar6 - ((int)cVar4 * (uint)bVar2 + (int)cVar3 * (uint)bVar1)) + uVar9;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      rgb_buf[lVar8 * 4 + 1] = (uint8_t)iVar10;
      iVar10 = ((int)sVar7 - (int)cVar5 * (uint)bVar2) + uVar9;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      rgb_buf[lVar8 * 4 + 2] = (uint8_t)iVar10;
      rgb_buf[lVar8 * 4 + 3] = 0xff;
      lVar8 = lVar8 + 1;
    } while (width != (int)lVar8);
  }
  return;
}

Assistant:

void I444ToARGBRow_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width; ++x) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    src_y += 1;
    src_u += 1;
    src_v += 1;
    rgb_buf += 4;  // Advance 1 pixel.
  }
}